

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::AddTaprootSchnorrSignRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::AddTaprootSchnorrSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  undefined8 uVar3;
  RawTransactionResponse res;
  RawTransactionResponseStruct response;
  AddTaprootSchnorrSignRequestStruct request;
  AddTaprootSchnorrSignRequest req;
  undefined1 local_420 [16];
  undefined *local_410 [2];
  int local_400;
  _Alloc_hider local_3f8;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  char local_3c8 [16];
  undefined1 local_3b8 [48];
  undefined1 auStack_388 [32];
  _Base_ptr p_Stack_368;
  size_t local_360;
  undefined1 local_358 [40];
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c0;
  string local_290;
  AddTaprootSchnorrSignRequestStruct local_270;
  AddTaprootSchnorrSignRequest local_158;
  
  AddTaprootSchnorrSignRequest::AddTaprootSchnorrSignRequest(&local_158);
  core::JsonClassBase<cfd::js::api::json::AddTaprootSchnorrSignRequest>::Deserialize
            (&local_158.super_JsonClassBase<cfd::js::api::json::AddTaprootSchnorrSignRequest>,
             (string *)this);
  AddTaprootSchnorrSignRequest::ConvertToStruct(&local_270,&local_158);
  local_358._0_8_ = local_358 + 0x10;
  local_358._8_8_ = 0;
  local_358[0x10] = '\0';
  local_358._32_4_ = 0;
  local_330._M_p = (pointer)&local_320;
  local_328 = 0;
  local_320._M_local_buf[0] = '\0';
  local_310._M_p = (pointer)&local_300;
  local_308 = 0;
  local_300._M_local_buf[0] = '\0';
  p_Var1 = &local_2f0._M_impl.super__Rb_tree_header;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_2f0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_270.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f39f3:
      uVar3 = std::__throw_bad_function_call();
      RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_420);
      psVar2 = (string *)(__return_storage_ptr__->_M_dataplus)._M_p;
      if (psVar2 != (string *)&local_330) {
        operator_delete(psVar2);
      }
      RawTransactionResponseStruct::~RawTransactionResponseStruct
                ((RawTransactionResponseStruct *)local_358);
      AddTaprootSchnorrSignRequestStruct::~AddTaprootSchnorrSignRequestStruct(&local_270);
      AddTaprootSchnorrSignRequest::~AddTaprootSchnorrSignRequest(&local_158);
      _Unwind_Resume(uVar3);
    }
    (*bitcoin_function->_M_invoker)
              ((RawTransactionResponseStruct *)local_420,(_Any_data *)bitcoin_function,&local_270);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f39f3;
    (**(code **)((long)&request_message->field_2 + 8))(local_420,request_message,&local_270);
  }
  std::__cxx11::string::operator=((string *)local_358,(string *)local_420);
  local_358._32_4_ = local_400;
  std::__cxx11::string::operator=((string *)&local_330,(string *)&local_3f8);
  std::__cxx11::string::operator=((string *)&local_310,(string *)(local_3e8 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_2f0);
  if ((_Base_ptr)local_3b8._16_8_ != (_Base_ptr)0x0) {
    local_2f0._M_impl.super__Rb_tree_header._M_header._M_color = local_3b8._8_4_;
    local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_3b8._16_8_;
    local_2f0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_3b8._24_8_;
    local_2f0._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_3b8._32_8_;
    *(_Rb_tree_header **)(local_3b8._16_8_ + 8) = p_Var1;
    local_2f0._M_impl.super__Rb_tree_header._M_node_count = local_3b8._40_8_;
    local_3b8._16_8_ = (_Base_ptr)0x0;
    local_3b8._40_8_ = 0;
    local_3b8._24_8_ = (_Base_ptr)(local_3b8 + 8);
    local_3b8._32_8_ = (_Base_ptr)(local_3b8 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_2c0);
  if ((_Base_ptr)auStack_388._16_8_ != (_Base_ptr)0x0) {
    local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = auStack_388._8_4_;
    local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_388._16_8_;
    local_2c0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_388._24_8_;
    local_2c0._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_368;
    *(_Rb_tree_header **)(auStack_388._16_8_ + 8) = &local_2c0._M_impl.super__Rb_tree_header;
    local_2c0._M_impl.super__Rb_tree_header._M_node_count = local_360;
    auStack_388._16_8_ = (_Base_ptr)0x0;
    local_360 = 0;
    auStack_388._24_8_ = (_Base_ptr)(auStack_388 + 8);
    p_Stack_368 = (_Base_ptr)(auStack_388 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_388);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_3b8);
  if ((char *)local_3d8._M_allocated_capacity != local_3c8) {
    operator_delete((void *)local_3d8._M_allocated_capacity);
  }
  if (local_3f8._M_p != local_3e8) {
    operator_delete(local_3f8._M_p);
  }
  if ((undefined1 *)local_420._0_8_ != local_420 + 0x10) {
    operator_delete((void *)local_420._0_8_);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_358._32_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_420);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_420,(RawTransactionResponseStruct *)local_358);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
              (&local_290,(JsonClassBase<cfd::js::api::json::RawTransactionResponse> *)local_420);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_420);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_420,(InnerErrorResponseStruct *)(local_358 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&local_290,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_420);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    local_420._0_8_ = &PTR__ErrorResponseBase_00a85a68;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_3e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_420 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_p != &local_300) {
    operator_delete(local_310._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_p != &local_320) {
    operator_delete(local_330._M_p);
  }
  if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
    operator_delete((void *)local_358._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_270.ignore_items._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_270.txin.ignore_items._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.annex._M_dataplus._M_p != &local_270.txin.annex.field_2) {
    operator_delete(local_270.txin.annex._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.sighash_type._M_dataplus._M_p != &local_270.txin.sighash_type.field_2) {
    operator_delete(local_270.txin.sighash_type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.signature._M_dataplus._M_p != &local_270.txin.signature.field_2) {
    operator_delete(local_270.txin.signature._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.txin.txid._M_dataplus._M_p != &local_270.txin.txid.field_2) {
    operator_delete(local_270.txin.txid._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.tx._M_dataplus._M_p != &local_270.tx.field_2) {
    operator_delete(local_270.tx._M_dataplus._M_p);
  }
  AddTaprootSchnorrSignRequest::~AddTaprootSchnorrSignRequest(&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}